

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

LoopAnalysis * __thiscall
dxil_spv::CFGStructurizer::analyze_loop
          (LoopAnalysis *__return_storage_ptr__,CFGStructurizer *this,CFGNode *node)

{
  bool bVar1;
  bool bVar2;
  reference ppCVar3;
  reference ppCVar4;
  size_type sVar5;
  reference ppCVar6;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_1e0;
  CFGNode **local_1d8;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_1d0;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_1c8;
  CFGNode *local_1c0;
  CFGNode *post_dominator;
  CFGNode **local_1b0;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_1a8;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_1a0;
  const_iterator local_198;
  CFGNode *local_190;
  CFGNode *common;
  CFGNode **local_180;
  CFGNode *local_178;
  CFGNode *non_dominated;
  iterator __end3;
  iterator __begin3;
  Vector<CFGNode_*> *__range3;
  CFGNode **local_150;
  CFGNode *local_148;
  CFGNode *dominated;
  iterator __end2;
  iterator __begin2;
  Vector<CFGNode_*> *__range2;
  CFGNode *pCStack_120;
  bool found_candidate;
  CFGNode *candidate;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_110;
  iterator continue_itr;
  CFGNode *pCStack_100;
  LoopExitType exit_type;
  CFGNode *loop_exit;
  iterator __end1;
  iterator __begin1;
  UnorderedSet<CFGNode_*> *__range1;
  LoopMergeTracer merge_tracer;
  CFGNode *pred;
  LoopBacktracer tracer;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  LoopAnalysis *result;
  
  tracer.traced_blocks._M_h._M_single_bucket._7_1_ = 0;
  LoopAnalysis::LoopAnalysis(__return_storage_ptr__);
  LoopBacktracer::LoopBacktracer((LoopBacktracer *)&pred);
  merge_tracer.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)node->pred_back_edge;
  LoopBacktracer::trace_to_parent
            ((LoopBacktracer *)&pred,node,
             (CFGNode *)merge_tracer.traced_blocks._M_h._M_single_bucket);
  LoopMergeTracer::LoopMergeTracer((LoopMergeTracer *)&__range1,(LoopBacktracer *)&pred);
  LoopMergeTracer::trace_from_parent((LoopMergeTracer *)&__range1,node);
  __end1 = std::
           unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ::begin((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)&merge_tracer);
  loop_exit = (CFGNode *)
              std::
              unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::end((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&merge_tracer);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<dxil_spv::CFGNode_*,_false>,
                            (_Node_iterator_base<dxil_spv::CFGNode_*,_false> *)&loop_exit), bVar1) {
    ppCVar3 = std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator*(&__end1);
    pCStack_100 = *ppCVar3;
    continue_itr._M_current._4_4_ = get_loop_exit_type(this,node,pCStack_100);
    switch(continue_itr._M_current._4_4_) {
    case Exit:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->direct_exits,&stack0xffffffffffffff00);
      break;
    case Merge:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->dominated_exit,&stack0xffffffffffffff00);
      break;
    case Escape:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->non_dominated_exit,&stack0xffffffffffffff00);
      break;
    case MergeToInfiniteLoop:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->dominated_continue_exit,&stack0xffffffffffffff00);
      break;
    case InnerLoopExit:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->inner_direct_exits,&stack0xffffffffffffff00);
      break;
    case InnerLoopMerge:
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&__return_storage_ptr__->inner_dominated_exit,&stack0xffffffffffffff00);
      break;
    case InnerLoopFalsePositive:
    }
    std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator++(&__end1);
  }
  local_110._M_current =
       (CFGNode **)
       std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::begin
                 (&__return_storage_ptr__->dominated_continue_exit);
  do {
    candidate = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end(&__return_storage_ptr__->dominated_continue_exit);
    bVar1 = __gnu_cxx::operator!=
                      (&local_110,
                       (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                        *)&candidate);
    if (!bVar1) {
      sVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&__return_storage_ptr__->dominated_continue_exit);
      if (1 < sVar5) {
        local_190 = find_common_post_dominator(&__return_storage_ptr__->dominated_continue_exit);
        if ((local_190 == (CFGNode *)0x0) || (bVar1 = CFGNode::dominates(node,local_190), !bVar1)) {
          local_1a0._M_current =
               (CFGNode **)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&__return_storage_ptr__->non_dominated_exit);
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
          ::__normal_iterator<dxil_spv::CFGNode**>
                    ((__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
                      *)&local_198,&local_1a0);
          local_1a8._M_current =
               (CFGNode **)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&__return_storage_ptr__->dominated_continue_exit);
          local_1b0 = (CFGNode **)
                      std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::end(&__return_storage_ptr__->dominated_continue_exit);
          post_dominator =
               (CFGNode *)
               std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
               insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,void>
                         ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                           *)&__return_storage_ptr__->non_dominated_exit,local_198,local_1a8,
                          (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                           )local_1b0);
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          clear(&__return_storage_ptr__->dominated_continue_exit);
        }
        else {
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          clear(&__return_storage_ptr__->dominated_continue_exit);
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back(&__return_storage_ptr__->dominated_continue_exit,&local_190);
        }
      }
      bVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::empty(&__return_storage_ptr__->dominated_exit);
      if ((bVar1) &&
         (bVar1 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty(&__return_storage_ptr__->inner_dominated_exit), !bVar1)) {
        std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                  (&__return_storage_ptr__->dominated_exit,
                   &__return_storage_ptr__->inner_dominated_exit);
      }
      bVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::empty(&__return_storage_ptr__->direct_exits);
      if (bVar1) {
        std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                  (&__return_storage_ptr__->direct_exits,&__return_storage_ptr__->inner_direct_exits
                  );
      }
      bVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::empty(&__return_storage_ptr__->dominated_exit);
      if ((bVar1) &&
         (bVar1 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty(&__return_storage_ptr__->direct_exits), !bVar1)) {
        std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                  (&__return_storage_ptr__->dominated_exit,&__return_storage_ptr__->direct_exits);
      }
      sVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&__return_storage_ptr__->direct_exits);
      if (((sVar5 == 1) &&
          (bVar1 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::empty(&__return_storage_ptr__->dominated_exit), bVar1)) &&
         (bVar1 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty(&__return_storage_ptr__->non_dominated_exit), bVar1)) {
        ppCVar6 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::front(&__return_storage_ptr__->direct_exits);
        bVar1 = CFGNode::dominates(node,*ppCVar6);
        if (bVar1) {
          std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                    (&__return_storage_ptr__->dominated_exit,&__return_storage_ptr__->direct_exits);
        }
        else {
          std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                    (&__return_storage_ptr__->non_dominated_exit,
                     &__return_storage_ptr__->direct_exits);
        }
      }
      sVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&__return_storage_ptr__->dominated_exit);
      if (1 < sVar5) {
        local_1c0 = find_common_post_dominator(&__return_storage_ptr__->dominated_exit);
        local_1d0._M_current =
             (CFGNode **)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&__return_storage_ptr__->dominated_exit);
        local_1d8 = (CFGNode **)
                    std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::end(&__return_storage_ptr__->dominated_exit);
        local_1c8 = std::
                    find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                              (local_1d0,
                               (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                )local_1d8,&local_1c0);
        local_1e0._M_current =
             (CFGNode **)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end(&__return_storage_ptr__->dominated_exit);
        bVar1 = __gnu_cxx::operator!=(&local_1c8,&local_1e0);
        if (bVar1) {
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          clear(&__return_storage_ptr__->dominated_exit);
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back(&__return_storage_ptr__->dominated_exit,&local_1c0);
        }
      }
      tracer.traced_blocks._M_h._M_single_bucket._7_1_ = 1;
      LoopMergeTracer::~LoopMergeTracer((LoopMergeTracer *)&__range1);
      LoopBacktracer::~LoopBacktracer((LoopBacktracer *)&pred);
      if ((tracer.traced_blocks._M_h._M_single_bucket._7_1_ & 1) == 0) {
        LoopAnalysis::~LoopAnalysis(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&local_110);
    pCStack_120 = *ppCVar4;
    bVar1 = false;
    __end2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&__return_storage_ptr__->dominated_exit);
    dominated = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end(&__return_storage_ptr__->dominated_exit);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&dominated), bVar2) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2);
      local_148 = *ppCVar4;
      bVar2 = query_reachability(this,pCStack_120,local_148);
      if (bVar2) {
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        push_back(&__return_storage_ptr__->non_dominated_exit,&stack0xfffffffffffffee0);
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
        ::__normal_iterator<dxil_spv::CFGNode**>
                  ((__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
                    *)&__range3,&local_110);
        local_150 = (CFGNode **)
                    std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::erase(&__return_storage_ptr__->dominated_continue_exit,
                            (const_iterator)__range3);
        bVar1 = true;
        local_110._M_current = local_150;
        break;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2);
    }
    if (!bVar1) {
      __end3 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&__return_storage_ptr__->non_dominated_exit);
      non_dominated =
           (CFGNode *)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end(&__return_storage_ptr__->non_dominated_exit);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                         *)&non_dominated), bVar2) {
        ppCVar4 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                  ::operator*(&__end3);
        local_178 = *ppCVar4;
        bVar2 = query_reachability(this,pCStack_120,local_178);
        if (bVar2) {
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back(&__return_storage_ptr__->non_dominated_exit,&stack0xfffffffffffffee0);
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
          ::__normal_iterator<dxil_spv::CFGNode**>
                    ((__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
                      *)&common,&local_110);
          local_180 = (CFGNode **)
                      std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::erase(&__return_storage_ptr__->dominated_continue_exit,
                              (const_iterator)common);
          bVar1 = true;
          local_110._M_current = local_180;
          break;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
        ::operator++(&__end3);
      }
    }
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&local_110);
    }
  } while( true );
}

Assistant:

CFGStructurizer::LoopAnalysis CFGStructurizer::analyze_loop(CFGNode *node) const
{
	LoopAnalysis result;

	// Now, we need to figure out which blocks belong in the loop construct.
	// The way to figure out a natural loop is any block which is dominated by loop header
	// and control flow passes to one of the back edges.

	// Unfortunately, it can be ambiguous which block is the merge block for a loop.
	// Ideally, there is a unique block which is the loop exit block, but if there are multiple breaks
	// there are multiple blocks which are not part of the loop construct.

	LoopBacktracer tracer;
	auto *pred = node->pred_back_edge;

	// Back-trace from here.
	// The CFG is reducible, so node must dominate pred.
	// Since node dominates pred, there is no pred chain we can follow without
	// eventually hitting node, and we'll stop traversal there.

	// All nodes which are touched during this traversal must be part of the loop construct.
	tracer.trace_to_parent(node, pred);

	LoopMergeTracer merge_tracer(tracer);
	merge_tracer.trace_from_parent(node);

	for (auto *loop_exit : merge_tracer.loop_exits)
	{
		auto exit_type = get_loop_exit_type(*node, *loop_exit);
		switch (exit_type)
		{
		case LoopExitType::Exit:
			result.direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopExit:
			// It's not an exit for us, but the inner loop.
			result.inner_direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::Merge:
			result.dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopMerge:
			result.inner_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopFalsePositive:
			// In this case, the inner loop can only exit at the loop header,
			// and thus post-dominance analysis will always fail.
			// Ignore this case as it's a false exit.
			break;

		case LoopExitType::Escape:
			result.non_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::MergeToInfiniteLoop:
			result.dominated_continue_exit.push_back(loop_exit);
			break;
		}
	}

	// A dominated continue exit should not be considered as such if it can reach other "normal" exits.
	// In this case, it's just a break.
	auto continue_itr = result.dominated_continue_exit.begin();
	while (continue_itr != result.dominated_continue_exit.end())
	{
		auto *candidate = *continue_itr;
		bool found_candidate = false;
		for (auto *dominated : result.dominated_exit)
		{
			if (query_reachability(*candidate, *dominated))
			{
				result.non_dominated_exit.push_back(candidate);
				continue_itr = result.dominated_continue_exit.erase(continue_itr);
				found_candidate = true;
				break;
			}
		}

		if (!found_candidate)
		{
			for (auto *non_dominated : result.non_dominated_exit)
			{
				if (query_reachability(*candidate, *non_dominated))
				{
					result.non_dominated_exit.push_back(candidate);
					continue_itr = result.dominated_continue_exit.erase(continue_itr);
					found_candidate = true;
					break;
				}
			}
		}

		if (!found_candidate)
			++continue_itr;
	}

	if (result.dominated_continue_exit.size() > 1)
	{
		// If we have multiple continue exit candidates, they better merge into a single clean candidate that we
		// still dominate, otherwise, ignore this case and treat them all as normal Escape nodes.
		auto *common = find_common_post_dominator(result.dominated_continue_exit);
		if (common && node->dominates(common))
		{
			result.dominated_continue_exit.clear();
			result.dominated_continue_exit.push_back(common);
		}
		else
		{
			result.non_dominated_exit.insert(result.non_dominated_exit.end(),
			                                 result.dominated_continue_exit.begin(),
			                                 result.dominated_continue_exit.end());
			result.dominated_continue_exit.clear();
		}
	}

	// If the only merge candidates we have are inner dominated, treat them as true dominated exits.
	if (result.dominated_exit.empty() && !result.inner_dominated_exit.empty())
		std::swap(result.dominated_exit, result.inner_dominated_exit);

	// If there are no direct exists, treat inner direct exists as direct exits.
	if (result.direct_exits.empty())
		std::swap(result.direct_exits, result.inner_direct_exits);

	// A direct exit can be considered a dominated exit if there are no better candidates.
	if (result.dominated_exit.empty() && !result.direct_exits.empty())
		std::swap(result.dominated_exit, result.direct_exits);

	// If we only have one direct exit, consider it our merge block.
	// Pick either Merge or Escape.
	if (result.direct_exits.size() == 1 && result.dominated_exit.empty() && result.non_dominated_exit.empty())
	{
		if (node->dominates(result.direct_exits.front()))
			std::swap(result.dominated_exit, result.direct_exits);
		else
			std::swap(result.non_dominated_exit, result.direct_exits);
	}

	if (result.dominated_exit.size() >= 2)
	{
		// Try to see if we can reduce the number of merge blocks to just 1.
		// This is relevant if we have various "clean" break blocks.
		auto *post_dominator = find_common_post_dominator(result.dominated_exit);
		if (std::find(result.dominated_exit.begin(), result.dominated_exit.end(),
		              post_dominator) != result.dominated_exit.end())
		{
			result.dominated_exit.clear();
			result.dominated_exit.push_back(post_dominator);
		}
	}

	return result;
}